

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::scanDigits(Parser *this,ParsedNumber *value)

{
  int i_00;
  ParsedNumber *in_RSI;
  Parser *in_RDI;
  int i;
  
  while( true ) {
    i_00 = consume(in_RDI);
    if (i_00 < 0) {
      return;
    }
    if ((i_00 < 0x30) || (0x39 < i_00)) break;
    ParsedNumber::addDigit(in_RSI,i_00);
  }
  unconsume(in_RDI);
  return;
}

Assistant:

void scanDigits(ParsedNumber& value) {
    while (true) {
      int i = consume();
      if (i < 0) {
        return;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return;
      }
      value.addDigit(i);
    }
  }